

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::LazyDescriptor::SetLazy
          (LazyDescriptor *this,string_view name,FileDescriptor *file)

{
  LogMessage *pLVar1;
  pointer this_00;
  size_type sVar2;
  once_flag *poVar3;
  const_pointer __src;
  bool bVar4;
  char *lazy_name;
  LogMessage local_b0;
  Voidify local_9a;
  byte local_99;
  LogMessage local_98;
  Voidify local_82;
  byte local_81;
  LogMessage local_80;
  Voidify local_6a;
  byte local_69;
  LogMessage local_68;
  Voidify local_55 [20];
  byte local_41;
  LogMessage local_40;
  Voidify local_29;
  FileDescriptor *local_28;
  FileDescriptor *file_local;
  LazyDescriptor *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (LazyDescriptor *)name._M_len;
  local_41 = 0;
  local_28 = file;
  file_local = (FileDescriptor *)this;
  if (this->descriptor_ != (Descriptor *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x28f8,"!descriptor_");
    local_41 = 1;
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
  }
  if ((local_41 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  local_69 = 0;
  if (this->once_ != (once_flag *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x28f9,"!once_");
    local_69 = 1;
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_55,pLVar1);
  }
  if ((local_69 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  local_81 = 0;
  bVar4 = false;
  if (local_28 != (FileDescriptor *)0x0) {
    bVar4 = local_28->pool_ != (DescriptorPool *)0x0;
  }
  if (!bVar4) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x28fa,"file && file->pool_");
    local_81 = 1;
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_6a,pLVar1);
  }
  if ((local_81 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  local_99 = 0;
  if (((local_28->pool_->lazily_build_dependencies_ ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x28fb,"file->pool_->lazily_build_dependencies_");
    local_99 = 1;
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_82,pLVar1);
  }
  if ((local_99 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_98);
  }
  if ((local_28->finished_building_ & 1U) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x28fc,"!file->finished_building_");
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_9a,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_b0);
  }
  this_00 = std::
            unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            ::operator->(&local_28->pool_->tables_);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  poVar3 = (once_flag *)DescriptorPool::Tables::AllocateBytes(this_00,(int)sVar2 + 5);
  absl::lts_20250127::once_flag::once_flag(poVar3);
  this->once_ = poVar3;
  poVar3 = this->once_;
  __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  memcpy(poVar3 + 1,__src,sVar2);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  *(undefined1 *)((long)&poVar3[1].control_.super___atomic_base<unsigned_int>._M_i + sVar2) = 0;
  return;
}

Assistant:

void LazyDescriptor::SetLazy(absl::string_view name,
                             const FileDescriptor* file) {
  // verify Init() has been called and Set hasn't been called yet.
  ABSL_CHECK(!descriptor_);
  ABSL_CHECK(!once_);
  ABSL_CHECK(file && file->pool_);
  ABSL_CHECK(file->pool_->lazily_build_dependencies_);
  ABSL_CHECK(!file->finished_building_);
  once_ = ::new (file->pool_->tables_->AllocateBytes(static_cast<int>(
      sizeof(absl::once_flag) + name.size() + 1))) absl::once_flag{};
  char* lazy_name = reinterpret_cast<char*>(once_ + 1);
  memcpy(lazy_name, name.data(), name.size());
  lazy_name[name.size()] = 0;
}